

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBase * ParseClassDefinition(ParseContext *ctx)

{
  Lexeme *begin;
  IntrusiveList<SynIdentifier> aliases_00;
  bool bVar1;
  int iVar2;
  LexemeType LVar3;
  SynAlign *align;
  undefined4 extraout_var;
  Lexeme *pLVar4;
  Lexeme *pLVar5;
  undefined4 extraout_var_00;
  SynClassDefinition *this;
  SynIdentifier *this_00;
  undefined4 extraout_var_03;
  SynBase *baseClass;
  SynClassElements *elements;
  undefined4 extraout_var_04;
  LexemeType LVar6;
  InplaceStr IVar7;
  SynIdentifier *local_70;
  IntrusiveList<SynIdentifier> aliases;
  TraceScope traceScope;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  begin = ctx->currentLexeme;
  align = ParseAlign(ctx);
  if (ctx->currentLexeme->type == lex_class) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
    bVar1 = anon_unknown.dwarf_1519a::CheckAt(ctx,lex_string,"ERROR: class name expected");
    if (bVar1) {
      IVar7 = ParseContext::Consume(ctx);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      local_70 = (SynIdentifier *)CONCAT44(extraout_var,iVar2);
      pLVar4 = ParseContext::Previous(ctx);
      pLVar5 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier(local_70,pLVar4,pLVar5,IVar7);
    }
    else {
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
      local_70 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar2);
      SynIdentifier::SynIdentifier(local_70,(InplaceStr)ZEXT816(0));
    }
    pLVar4 = ctx->currentLexeme;
    LVar6 = pLVar4->type;
    if (LVar6 == lex_semicolon) {
      ctx->currentLexeme = pLVar4 + 1;
      if (align != (SynAlign *)0x0) {
        anon_unknown.dwarf_1519a::Report
                  (ctx,pLVar4 + 1,"ERROR: can\'t specify alignment of a class prototype");
      }
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      this = (SynClassDefinition *)CONCAT44(extraout_var_01,iVar2);
      pLVar4 = ParseContext::Previous(ctx);
      SynClassPrototype::SynClassPrototype((SynClassPrototype *)this,begin,pLVar4,local_70);
    }
    else {
      aliases.head = (SynIdentifier *)0x0;
      aliases.tail = (SynIdentifier *)0x0;
      if (LVar6 == lex_less) {
        ctx->currentLexeme = pLVar4 + 1;
        bVar1 = anon_unknown.dwarf_1519a::CheckAt
                          (ctx,lex_string,"ERROR: generic type alias required after \'<\'");
        if (bVar1) {
          IVar7 = ParseContext::Consume(ctx);
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          this_00 = (SynIdentifier *)CONCAT44(extraout_var_02,iVar2);
          pLVar4 = ParseContext::Previous(ctx);
          pLVar5 = ParseContext::Previous(ctx);
          SynIdentifier::SynIdentifier(this_00,pLVar4,pLVar5,IVar7);
          while( true ) {
            IntrusiveList<SynIdentifier>::push_back(&aliases,this_00);
            if (ctx->currentLexeme->type != lex_comma) break;
            ctx->currentLexeme = ctx->currentLexeme + 1;
            bVar1 = anon_unknown.dwarf_1519a::CheckAt
                              (ctx,lex_string,"ERROR: generic type alias required after \',\'");
            if (!bVar1) break;
            IVar7 = ParseContext::Consume(ctx);
            iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            this_00 = (SynIdentifier *)CONCAT44(extraout_var_03,iVar2);
            pLVar4 = ParseContext::Previous(ctx);
            pLVar5 = ParseContext::Previous(ctx);
            SynIdentifier::SynIdentifier(this_00,pLVar4,pLVar5,IVar7);
          }
        }
        anon_unknown.dwarf_1519a::CheckConsume
                  (ctx,lex_greater,"ERROR: \'>\' expected after generic type alias list");
        pLVar4 = ctx->currentLexeme;
        LVar6 = pLVar4->type;
      }
      LVar3 = LVar6;
      if (LVar6 == lex_extendable) {
        ctx->currentLexeme = pLVar4 + 1;
        pLVar5 = pLVar4 + 1;
        pLVar4 = pLVar4 + 1;
        LVar3 = pLVar5->type;
      }
      if (LVar3 == lex_colon) {
        ctx->currentLexeme = pLVar4 + 1;
        baseClass = ParseType(ctx,(bool *)0x0,false);
        if (baseClass == (SynBase *)0x0) {
          baseClass = (SynBase *)0x0;
          anon_unknown.dwarf_1519a::Report
                    (ctx,ctx->currentLexeme,"ERROR: base type name is expected at this point");
        }
      }
      else {
        baseClass = (SynBase *)0x0;
      }
      anon_unknown.dwarf_1519a::CheckConsume
                (ctx,lex_ofigure,"ERROR: \'{\' not found after class name");
      if ((ParseClassDefinition(ParseContext&)::token == '\0') &&
         (iVar2 = __cxa_guard_acquire(&ParseClassDefinition(ParseContext&)::token), iVar2 != 0)) {
        ParseClassDefinition::token = NULLC::TraceGetToken("parse","ParseClassBody");
        __cxa_guard_release(&ParseClassDefinition(ParseContext&)::token);
      }
      NULLC::TraceScope::TraceScope(&traceScope,ParseClassDefinition::token);
      NULLC::TraceLabel((local_70->name).begin,(local_70->name).end);
      elements = ParseClassElements(ctx);
      anon_unknown.dwarf_1519a::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after class definition");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
      this = (SynClassDefinition *)CONCAT44(extraout_var_04,iVar2);
      pLVar4 = ParseContext::Previous(ctx);
      aliases_00.tail = aliases.tail;
      aliases_00.head = aliases.head;
      SynClassDefinition::SynClassDefinition
                (this,begin,pLVar4,align,local_70,aliases_00,LVar6 == lex_extendable,baseClass,
                 elements);
      NULLC::TraceScope::~TraceScope(&traceScope);
    }
  }
  else {
    ctx->currentLexeme = begin;
    this = (SynClassDefinition *)0x0;
  }
  return &this->super_SynBase;
}

Assistant:

SynBase* ParseClassDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	SynAlign *align = ParseAlign(ctx);

	if(ctx.Consume(lex_class))
	{
		SynIdentifier *nameIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: class name expected"))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else
		{
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		if(ctx.Consume(lex_semicolon))
		{
			if(align)
				Report(ctx, ctx.Current(), "ERROR: can't specify alignment of a class prototype");

			return new (ctx.get<SynClassPrototype>()) SynClassPrototype(start, ctx.Previous(), nameIdentifier);
		}

		IntrusiveList<SynIdentifier> aliases;

		if(ctx.Consume(lex_less))
		{
			if(CheckAt(ctx, lex_string, "ERROR: generic type alias required after '<'"))
			{
				InplaceStr alias = ctx.Consume();

				aliases.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), alias));

				while(ctx.Consume(lex_comma))
				{
					if(!CheckAt(ctx, lex_string, "ERROR: generic type alias required after ','"))
						break;

					alias = ctx.Consume();

					aliases.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), alias));
				}
			}

			CheckConsume(ctx, lex_greater, "ERROR: '>' expected after generic type alias list");
		}

		bool extendable = ctx.Consume(lex_extendable);

		SynBase *baseClass = NULL;

		if(ctx.Consume(lex_colon))
		{
			baseClass = ParseType(ctx);

			if(!baseClass)
				Report(ctx, ctx.Current(), "ERROR: base type name is expected at this point");
		}

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after class name");

		TRACE_SCOPE("parse", "ParseClassBody");

		if(nameIdentifier)
			TRACE_LABEL2(nameIdentifier->name.begin, nameIdentifier->name.end);

		SynClassElements *elements = ParseClassElements(ctx);

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after class definition");

		return new (ctx.get<SynClassDefinition>()) SynClassDefinition(start, ctx.Previous(), align, nameIdentifier, aliases, extendable, baseClass, elements);
	}

	// Backtrack
	ctx.currentLexeme = start;

	return NULL;
}